

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O0

int DSA_check_signature(int *out_valid,uint8_t *digest,size_t digest_len,uint8_t *sig,size_t sig_len
                       ,DSA *dsa)

{
  int iVar1;
  DSA_SIG *pDVar2;
  uchar *puStack_58;
  int der_len;
  uint8_t *sigp;
  uint8_t *der;
  DSA_SIG *pDStack_40;
  int ret;
  DSA_SIG *s;
  DSA *dsa_local;
  size_t sig_len_local;
  uint8_t *sig_local;
  size_t digest_len_local;
  uint8_t *digest_local;
  int *out_valid_local;
  
  pDStack_40 = (DSA_SIG *)0x0;
  der._4_4_ = 0;
  sigp = (uint8_t *)0x0;
  s = (DSA_SIG *)dsa;
  dsa_local = (DSA *)sig_len;
  sig_len_local = (size_t)sig;
  sig_local = (uint8_t *)digest_len;
  digest_len_local = (size_t)digest;
  digest_local = (uint8_t *)out_valid;
  pDStack_40 = DSA_SIG_new();
  if (pDStack_40 != (DSA_SIG *)0x0) {
    puStack_58 = (uchar *)sig_len_local;
    pDVar2 = d2i_DSA_SIG(&stack0xffffffffffffffc0,&stack0xffffffffffffffa8,(long)dsa_local);
    if ((((pDVar2 != (DSA_SIG *)0x0) &&
         (puStack_58 == (uchar *)((long)&dsa_local->p + sig_len_local))) &&
        (iVar1 = i2d_DSA_SIG(pDStack_40,&sigp), -1 < iVar1)) &&
       (((DSA *)(long)iVar1 == dsa_local &&
        (iVar1 = OPENSSL_memcmp((void *)sig_len_local,sigp,(size_t)dsa_local), iVar1 == 0)))) {
      der._4_4_ = DSA_do_check_signature
                            ((int *)digest_local,(uint8_t *)digest_len_local,(size_t)sig_local,
                             (DSA_SIG *)pDStack_40,(DSA *)s);
    }
  }
  OPENSSL_free(sigp);
  DSA_SIG_free(pDStack_40);
  return der._4_4_;
}

Assistant:

int DSA_check_signature(int *out_valid, const uint8_t *digest,
                        size_t digest_len, const uint8_t *sig, size_t sig_len,
                        const DSA *dsa) {
  DSA_SIG *s = NULL;
  int ret = 0;
  uint8_t *der = NULL;

  s = DSA_SIG_new();
  {
    if (s == NULL) {
      goto err;
    }

    const uint8_t *sigp = sig;
    if (d2i_DSA_SIG(&s, &sigp, sig_len) == NULL || sigp != sig + sig_len) {
      goto err;
    }

    // Ensure that the signature uses DER and doesn't have trailing garbage.
    int der_len = i2d_DSA_SIG(s, &der);
    if (der_len < 0 || (size_t)der_len != sig_len ||
        OPENSSL_memcmp(sig, der, sig_len)) {
      goto err;
    }

    ret = DSA_do_check_signature(out_valid, digest, digest_len, s, dsa);
  }

err:
  OPENSSL_free(der);
  DSA_SIG_free(s);
  return ret;
}